

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int js_shape_prepare_update(JSContext *ctx,JSObject *p,JSShapeProperty **pprs)

{
  int iVar1;
  JSRuntime *pJVar2;
  JSShape *pJVar3;
  JSShape **ppJVar4;
  JSShape *pJVar5;
  JSShape **ppJVar6;
  ulong uVar7;
  
  pJVar5 = p->shape;
  if (pJVar5->is_hashed != '\0') {
    if ((pJVar5->header).ref_count != 1) {
      if (pprs == (JSShapeProperty **)0x0) {
        uVar7 = 0;
      }
      else {
        uVar7 = (ulong)((long)*pprs + (-0x40 - (long)pJVar5)) >> 3 & 0xffffffff;
      }
      pJVar5 = js_clone_shape(ctx,pJVar5);
      if (pJVar5 == (JSShape *)0x0) {
        return -1;
      }
      pJVar2 = ctx->rt;
      pJVar3 = p->shape;
      iVar1 = (pJVar3->header).ref_count;
      (pJVar3->header).ref_count = iVar1 + -1;
      if (iVar1 < 2) {
        js_free_shape0(pJVar2,pJVar3);
      }
      p->shape = pJVar5;
      if (pprs == (JSShapeProperty **)0x0) {
        return 0;
      }
      *pprs = (JSShapeProperty *)(&pJVar5[1].header.ref_count + uVar7 * 2);
      return 0;
    }
    pJVar2 = ctx->rt;
    ppJVar4 = pJVar2->shape_hash + (pJVar5->hash >> (-(char)pJVar2->shape_hash_bits & 0x1fU));
    do {
      ppJVar6 = ppJVar4;
      pJVar3 = *ppJVar6;
      ppJVar4 = &pJVar3->shape_hash_next;
    } while (pJVar3 != pJVar5);
    *ppJVar6 = pJVar5->shape_hash_next;
    pJVar2->shape_hash_count = pJVar2->shape_hash_count + -1;
    pJVar5->is_hashed = '\0';
  }
  return 0;
}

Assistant:

static int js_shape_prepare_update(JSContext *ctx, JSObject *p,
                                   JSShapeProperty **pprs)
{
    JSShape *sh;
    uint32_t idx = 0;    /* prevent warning */

    sh = p->shape;
    if (sh->is_hashed) {
        if (sh->header.ref_count != 1) {
            if (pprs)
                idx = *pprs - get_shape_prop(sh);
            /* clone the shape (the resulting one is no longer hashed) */
            sh = js_clone_shape(ctx, sh);
            if (!sh)
                return -1;
            js_free_shape(ctx->rt, p->shape);
            p->shape = sh;
            if (pprs)
                *pprs = get_shape_prop(sh) + idx;
        } else {
            js_shape_hash_unlink(ctx->rt, sh);
            sh->is_hashed = FALSE;
        }
    }
    return 0;
}